

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O0

QList<QBenchmarkMeasurerBase::Measurement> * __thiscall
QBenchmarkPerfEventsMeasurer::stop(QBenchmarkPerfEventsMeasurer *this)

{
  long lVar1;
  Type *this_00;
  qsizetype qVar2;
  reference pMVar3;
  QList<QBenchmarkMeasurerBase::Measurement> *in_RDI;
  long in_FS_OFFSET;
  Measurement MVar4;
  qsizetype i;
  QList<PerfEvent> *counters;
  QList<QBenchmarkMeasurerBase::Measurement> *result;
  qsizetype in_stack_ffffffffffffff68;
  QList<QBenchmarkMeasurerBase::Measurement> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  Initialization in_stack_ffffffffffffff84;
  QBenchmarkPerfEventsMeasurer *in_stack_ffffffffffffff88;
  QList<QBenchmarkMeasurerBase::Measurement> *in_stack_ffffffffffffff90;
  long lVar5;
  long local_40;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prctl(0x1f);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>::
            operator*((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>
                       *)0x124044);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (Measurement *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<PerfEvent>::size(this_00);
  QList<QBenchmarkMeasurerBase::Measurement>::QList
            (in_stack_ffffffffffffff90,(qsizetype)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84);
  local_40 = 0;
  while (lVar5 = local_40, qVar2 = QList<PerfEvent>::size(this_00), lVar5 < qVar2) {
    MVar4 = readValue(in_stack_ffffffffffffff88,
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffff84 = MVar4.metric;
    in_stack_ffffffffffffff88 = (QBenchmarkPerfEventsMeasurer *)MVar4.value;
    pMVar3 = QList<QBenchmarkMeasurerBase::Measurement>::operator[]
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pMVar3->value = MVar4.value;
    *(ulong *)&pMVar3->metric = CONCAT44(uStack_c,MVar4.metric);
    local_40 = local_40 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QBenchmarkMeasurerBase::Measurement> QBenchmarkPerfEventsMeasurer::stop()
{
    // disable the counters
    prctl(PR_TASK_PERF_EVENTS_DISABLE);

    const QList<PerfEvent> &counters = *eventTypes;
    QList<Measurement> result(counters.size(), {});
    for (qsizetype i = 0; i < counters.size(); ++i) {
        result[i] = readValue(i);
    }
    return result;
}